

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLGrammarPoolImpl::deserializeGrammars(XMLGrammarPoolImpl *this,BinInputStream *binIn)

{
  bool bVar1;
  uint uVar2;
  MemoryManager *memoryManager;
  XSerializationException *pXVar3;
  OutOfMemoryException *anon_var_0;
  XMLCh LoaderLevelChar [5];
  XMLCh StorerLevelChar [5];
  uint StorerLevel;
  XSerializeEngine serEng;
  undefined1 local_80 [8];
  JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl> cleanup;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  uint stringCount;
  MemoryManager *memMgr;
  BinInputStream *binIn_local;
  XMLGrammarPoolImpl *this_local;
  
  memoryManager = XMLGrammarPool::getMemoryManager(&this->super_XMLGrammarPool);
  uVar2 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[0xb])();
  if (uVar2 != 0) {
    if (4 < uVar2) {
      pXVar3 = (XSerializationException *)__cxa_allocate_exception(0x30);
      XSerializationException::XSerializationException
                (pXVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
                 ,0x11c,XSer_StringPool_NotEmpty,memoryManager);
      __cxa_throw(pXVar3,&XSerializationException::typeinfo,
                  XSerializationException::~XSerializationException);
    }
    (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[8])();
  }
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
  RefHashTableOfEnumerator
            ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
             &cleanup.field_0x10,this->fGrammarRegistry,false,memoryManager);
  bVar1 = RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::hasMoreElements
                    ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                     &cleanup.field_0x10);
  if (!bVar1) {
    JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl>::JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl> *)local_80,this,(MFPT)cleanUp);
    XSerializeEngine::XSerializeEngine
              ((XSerializeEngine *)(StorerLevelChar + 3),binIn,&this->super_XMLGrammarPool,0x2000);
    XSerializeEngine::operator>>
              ((XSerializeEngine *)(StorerLevelChar + 3),(uint *)(StorerLevelChar + 1));
    if (StorerLevelChar._2_4_ != 7) {
      XMLString::binToText(StorerLevelChar._2_4_,LoaderLevelChar + 1,4,10,memoryManager);
      XMLString::binToText(7,(XMLCh *)&anon_var_0,4,10,memoryManager);
      pXVar3 = (XSerializationException *)__cxa_allocate_exception(0x30);
      XSerializationException::XSerializationException
                (pXVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
                 ,0x140,XSer_Storer_Loader_Mismatch,LoaderLevelChar + 1,(XMLCh *)&anon_var_0,
                 (XMLCh *)0x0,(XMLCh *)0x0,memoryManager);
      __cxa_throw(pXVar3,&XSerializationException::typeinfo,
                  XSerializationException::~XSerializationException);
    }
    XSerializeEngine::operator>>((XSerializeEngine *)(StorerLevelChar + 3),&this->fLocked);
    (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[3])
              (this->fStringPool,StorerLevelChar + 3);
    XTemplateSerializer::loadObject
              (&this->fGrammarRegistry,0x1d,true,(XSerializeEngine *)(StorerLevelChar + 3));
    XSerializeEngine::~XSerializeEngine((XSerializeEngine *)(StorerLevelChar + 3));
    JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl>::release
              ((JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl> *)local_80);
    if ((this->fLocked & 1U) != 0) {
      (*(this->super_XMLGrammarPool)._vptr_XMLGrammarPool[0x11])();
    }
    JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl>::~JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl> *)local_80);
    RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
               &cleanup.field_0x10);
    return;
  }
  pXVar3 = (XSerializationException *)__cxa_allocate_exception(0x30);
  XSerializationException::XSerializationException
            (pXVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
             ,0x123,XSer_GrammarPool_NotEmpty,memoryManager);
  __cxa_throw(pXVar3,&XSerializationException::typeinfo,
              XSerializationException::~XSerializationException);
}

Assistant:

void XMLGrammarPoolImpl::deserializeGrammars(BinInputStream* const binIn)
{
    MemoryManager *memMgr = getMemoryManager();
    unsigned int stringCount = fStringPool->getStringCount();
    if (stringCount)
    {
        /***
         * it contains only the four predefined one, that is ok
         * but we need to reset the string before deserialize it
         *
         ***/
        if ( stringCount <= 4 )
        {
            fStringPool->flushAll();
        }
        else
        {
            ThrowXMLwithMemMgr(XSerializationException, XMLExcepts::XSer_StringPool_NotEmpty, memMgr);
        }
    }

    RefHashTableOfEnumerator<Grammar> grammarEnum(fGrammarRegistry, false, memMgr);
    if (grammarEnum.hasMoreElements())
    {
        ThrowXMLwithMemMgr(XSerializationException, XMLExcepts::XSer_GrammarPool_NotEmpty, memMgr);
    }

    // This object will take care of cleaning up if an exception is
    // thrown during deserialization.
    JanitorMemFunCall<XMLGrammarPoolImpl>   cleanup(this, &XMLGrammarPoolImpl::cleanUp);

    try
    {
        XSerializeEngine  serEng(binIn, this);

        //version information
        unsigned int  StorerLevel;
        serEng>>StorerLevel;
        serEng.fStorerLevel = StorerLevel;

        // The storer level must match the loader level.
        //
        if (StorerLevel != (unsigned int)XERCES_GRAMMAR_SERIALIZATION_LEVEL)
        {
            XMLCh     StorerLevelChar[5];
            XMLCh     LoaderLevelChar[5];
            XMLString::binToText(StorerLevel,                          StorerLevelChar,   4, 10, memMgr);
            XMLString::binToText(XERCES_GRAMMAR_SERIALIZATION_LEVEL,   LoaderLevelChar,   4, 10, memMgr);

            ThrowXMLwithMemMgr2(XSerializationException
                    , XMLExcepts::XSer_Storer_Loader_Mismatch
                    , StorerLevelChar
                    , LoaderLevelChar
                    , memMgr);
        }

        //lock status
        serEng>>fLocked;

        //StringPool, don't use >>
        fStringPool->serialize(serEng);

        /***
         * Deserialize RefHashTableOf<Grammar>*    fGrammarRegistry;
         ***/
        XTemplateSerializer::loadObject(&fGrammarRegistry, 29, true, serEng);

    }
    catch(const OutOfMemoryException&)
    {
        // This is a special case, because we don't want
        // to execute cleanup code on out-of-memory
        // conditions.
        cleanup.release();

        throw;
    }

    // Everything is OK, so we can release the cleanup object.
    cleanup.release();

    if (fLocked)
    {
        createXSModel();
    }
}